

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator-(Clifford *__return_storage_ptr__,Clifford *A,float tv)

{
  vector<Blade,_std::allocator<Blade>_> local_80;
  vector<Blade,_std::allocator<Blade>_> local_68;
  Blade local_40;
  undefined1 local_38 [8];
  Clifford R;
  float tv_local;
  Clifford *A_local;
  
  R.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tv;
  std::vector<Blade,_std::allocator<Blade>_>::vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_38);
  Blade::Blade(&local_40,0,
               -R.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_);
  std::vector<Blade,_std::allocator<Blade>_>::push_back
            ((vector<Blade,_std::allocator<Blade>_> *)local_38,&local_40);
  Blade::~Blade(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_68,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector
            (&local_80,(vector<Blade,_std::allocator<Blade>_> *)local_38);
  operator+(__return_storage_ptr__,&local_68,&local_80);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_80);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
  std::vector<Blade,_std::allocator<Blade>_>::~vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator-(Clifford A,float tv)
{
	Clifford R;R.push_back(Blade(0,-1*tv));
	return (A+R);
}